

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::Equals::~Equals(Equals *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Equals_001f0d78;
  CasedString::~CasedString((CasedString *)0x1820aa);
  MatcherImpl<Catch::Matchers::Impl::StdString::Equals,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MatcherImpl((MatcherImpl<Catch::Matchers::Impl::StdString::Equals,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1820b4);
  return;
}

Assistant:

Matchers::Impl::StdString::Equals::~Equals() {}